

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddFocusEvent(ImGuiIO *this,bool focused)

{
  ImGuiInputEvent e;
  ImGuiContext *g;
  ImGuiInputEvent *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd4;
  
  ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x110358);
  ImVector<ImGuiInputEvent>::push_back
            ((ImVector<ImGuiInputEvent> *)CONCAT44(in_stack_ffffffffffffffd4,6),
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void ImGuiIO::AddFocusEvent(bool focused)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Focus;
    e.AppFocused.Focused = focused;
    g.InputEventsQueue.push_back(e);
}